

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_BasicInequivalencyTest_Test::TestBody
          (MessageDifferencerTest_BasicInequivalencyTest_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_6d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_6c8;
  string local_6c0;
  AssertionResult gtest_ar_;
  TestAllTypes msg2;
  TestAllTypes msg1;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&msg1);
  proto2_unittest::TestAllTypes::TestAllTypes(&msg2);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&msg1);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&msg2);
  msg1.field_0._impl_.optional_int32_ = -1;
  msg1.field_0._impl_._has_bits_.has_bits_[0]._1_1_ =
       msg1.field_0._impl_._has_bits_.has_bits_[0]._1_1_ | 0x10;
  bVar1 = util::MessageDifferencer::Equivalent(&msg1.super_Message,&msg2.super_Message);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_6c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6c0,(internal *)&gtest_ar_,
               (AssertionResult *)"util::MessageDifferencer::Equivalent(msg1, msg2)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x2db,local_6c0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_6d0,(Message *)&local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    std::__cxx11::string::~string((string *)&local_6c0);
    if (local_6c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6c8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes(&msg2);
  proto2_unittest::TestAllTypes::~TestAllTypes(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, BasicInequivalencyTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  msg1.set_optional_int32(-1);

  // Compare
  EXPECT_FALSE(util::MessageDifferencer::Equivalent(msg1, msg2));
}